

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlFAFinishReduceEpsilonTransitions(xmlRegParserCtxtPtr ctxt,int tonr)

{
  xmlRegStatePtr pxVar1;
  xmlRegTrans *pxVar2;
  xmlRegTransPtr t1;
  xmlRegStatePtr to;
  int transnr;
  int tonr_local;
  xmlRegParserCtxtPtr ctxt_local;
  
  pxVar1 = ctxt->states[tonr];
  if (((pxVar1 != (xmlRegStatePtr)0x0) && (pxVar1->mark != XML_REGEXP_MARK_START)) &&
     (pxVar1->mark != XML_REGEXP_MARK_NORMAL)) {
    pxVar1->mark = XML_REGEXP_MARK_NORMAL;
    for (to._0_4_ = 0; (int)to < pxVar1->nbTrans; to._0_4_ = (int)to + 1) {
      pxVar2 = pxVar1->trans + (int)to;
      if ((-1 < pxVar2->to) && (pxVar2->atom == (xmlRegAtomPtr)0x0)) {
        xmlFAFinishReduceEpsilonTransitions(ctxt,pxVar2->to);
      }
    }
  }
  return;
}

Assistant:

static void
xmlFAFinishReduceEpsilonTransitions(xmlRegParserCtxtPtr ctxt, int tonr) {
    int transnr;
    xmlRegStatePtr to;

    to = ctxt->states[tonr];
    if (to == NULL)
	return;
    if ((to->mark == XML_REGEXP_MARK_START) ||
	(to->mark == XML_REGEXP_MARK_NORMAL))
	return;

    to->mark = XML_REGEXP_MARK_NORMAL;
    for (transnr = 0;transnr < to->nbTrans;transnr++) {
	xmlRegTransPtr t1 = &to->trans[transnr];
	if ((t1->to >= 0) && (t1->atom == NULL))
            xmlFAFinishReduceEpsilonTransitions(ctxt, t1->to);
    }
}